

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O1

void __thiscall
syntax_tests::iu_PrintToTest_x_iutest_x_RawArray_Test::Body
          (iu_PrintToTest_x_iutest_x_RawArray_Test *this)

{
  pointer pcVar1;
  uchar d [3];
  uchar c [3];
  uchar b [3];
  uchar a [3];
  iu_global_format_stringstream strm;
  uchar local_438 [4];
  uchar local_434 [4];
  uchar local_430 [4];
  uchar local_42c [4];
  undefined1 local_428 [16];
  undefined1 local_418 [24];
  undefined8 local_400;
  ios_base local_3a8 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  string local_260;
  string local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  undefined1 local_1a0 [32];
  char *local_180;
  undefined8 local_178;
  ios_base local_120 [264];
  
  local_42c[2] = '\x02';
  local_42c[0] = '\0';
  local_42c[1] = '\x01';
  local_430[2] = '\x02';
  local_430[0] = '\0';
  local_430[1] = '\x01';
  local_434[2] = '\x02';
  local_434[0] = '\0';
  local_434[1] = '\x01';
  local_438[2] = '\x02';
  local_438[0] = '\0';
  local_438[1] = '\x01';
  memset((iu_global_format_stringstream *)local_1a0,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1a0);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_428);
  iutest::detail::iuUniversalPrinter<unsigned_char[3]>::Print
            ((uchar (*) [3])local_42c,(iu_ostream *)local_418);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_428);
  std::ios_base::~ios_base(local_3a8);
  iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a0,&local_1c0);
  local_428._0_8_ = (iu_ostream *)local_418;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"Succeeded.\n","");
  local_418._16_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp";
  local_400 = 0x3eb;
  iutest::AssertionHelper::OnFixed((AssertionHelper *)local_428,(Fixed *)local_1a0,false);
  if ((iu_ostream *)local_428._0_8_ != (iu_ostream *)local_418) {
    operator_delete((void *)local_428._0_8_,local_418._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
  std::ios_base::~ios_base(local_120);
  memset((iu_global_format_stringstream *)local_1a0,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1a0);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_428);
  iutest::detail::iuUniversalPrinter<unsigned_char[3]>::Print
            ((uchar (*) [3])local_430,(iu_ostream *)local_418);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_428);
  std::ios_base::~ios_base(local_3a8);
  iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a0,&local_1e0);
  local_428._0_8_ = (iu_ostream *)local_418;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"Succeeded.\n","");
  local_418._16_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp";
  local_400 = 0x3ec;
  iutest::AssertionHelper::OnFixed((AssertionHelper *)local_428,(Fixed *)local_1a0,false);
  if ((iu_ostream *)local_428._0_8_ != (iu_ostream *)local_418) {
    operator_delete((void *)local_428._0_8_,local_418._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
  std::ios_base::~ios_base(local_120);
  memset((iu_global_format_stringstream *)local_1a0,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1a0);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_428);
  iutest::detail::iuUniversalPrinter<volatile_unsigned_char[3]>::Print
            ((uchar (*) [3])local_434,(iu_ostream *)local_418);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_428);
  std::ios_base::~ios_base(local_3a8);
  iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a0,&local_200);
  local_428._0_8_ = (iu_ostream *)local_418;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"Succeeded.\n","");
  local_418._16_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp";
  local_400 = 0x3ed;
  iutest::AssertionHelper::OnFixed((AssertionHelper *)local_428,(Fixed *)local_1a0,false);
  if ((iu_ostream *)local_428._0_8_ != (iu_ostream *)local_418) {
    operator_delete((void *)local_428._0_8_,local_418._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
  std::ios_base::~ios_base(local_120);
  memset((iu_global_format_stringstream *)local_1a0,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1a0);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_428);
  iutest::detail::iuUniversalPrinter<volatile_unsigned_char[3]>::Print
            ((uchar (*) [3])local_438,(iu_ostream *)local_418);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_428);
  std::ios_base::~ios_base(local_3a8);
  iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a0,&local_220);
  local_428._0_8_ = (iu_ostream *)local_418;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"Succeeded.\n","");
  local_418._16_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp";
  local_400 = 0x3ee;
  iutest::AssertionHelper::OnFixed((AssertionHelper *)local_428,(Fixed *)local_1a0,false);
  if ((iu_ostream *)local_428._0_8_ != (iu_ostream *)local_418) {
    operator_delete((void *)local_428._0_8_,local_418._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
  std::ios_base::~ios_base(local_120);
  local_42c[2] = '\x02';
  local_42c[0] = '\0';
  local_42c[1] = '\x01';
  local_430[2] = '\x02';
  local_430[0] = '\0';
  local_430[1] = '\x01';
  local_434[2] = '\x02';
  local_434[0] = '\0';
  local_434[1] = '\x01';
  local_438[2] = '\x02';
  local_438[0] = '\0';
  local_438[1] = '\x01';
  memset((iu_global_format_stringstream *)local_428,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_428);
  iutest::PrintToString<char[3]>(&local_240,(char (*) [3])local_42c);
  iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_428,&local_240);
  pcVar1 = local_1a0 + 0x10;
  local_1a0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"Succeeded.\n","");
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp";
  local_178 = 0x3f6;
  iutest::AssertionHelper::OnFixed((AssertionHelper *)local_1a0,(Fixed *)local_428,false);
  if ((pointer)local_1a0._0_8_ != pcVar1) {
    operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_428);
  std::ios_base::~ios_base(local_3a8);
  memset((iu_global_format_stringstream *)local_428,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_428);
  iutest::PrintToString<char[3]>(&local_260,(char (*) [3])local_430);
  iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_428,&local_260);
  local_1a0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"Succeeded.\n","");
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp";
  local_178 = 0x3f7;
  iutest::AssertionHelper::OnFixed((AssertionHelper *)local_1a0,(Fixed *)local_428,false);
  if ((pointer)local_1a0._0_8_ != pcVar1) {
    operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_428);
  std::ios_base::~ios_base(local_3a8);
  memset((iu_global_format_stringstream *)local_1a0,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1a0);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_428);
  iutest::detail::iuUniversalPrinter<volatile_char[3]>::Print
            ((char (*) [3])local_434,(iu_ostream *)local_418);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_428);
  std::ios_base::~ios_base(local_3a8);
  iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a0,&local_280);
  local_428._0_8_ = (iu_ostream *)local_418;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"Succeeded.\n","");
  local_418._16_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp";
  local_400 = 0x3f8;
  iutest::AssertionHelper::OnFixed((AssertionHelper *)local_428,(Fixed *)local_1a0,false);
  if ((iu_ostream *)local_428._0_8_ != (iu_ostream *)local_418) {
    operator_delete((void *)local_428._0_8_,local_418._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
  std::ios_base::~ios_base(local_120);
  memset((iu_global_format_stringstream *)local_1a0,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1a0);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_428);
  iutest::detail::iuUniversalPrinter<volatile_char[3]>::Print
            ((char (*) [3])local_438,(iu_ostream *)local_418);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_428);
  std::ios_base::~ios_base(local_3a8);
  iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a0,&local_2a0);
  local_428._0_8_ = (iu_ostream *)local_418;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"Succeeded.\n","");
  local_418._16_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp";
  local_400 = 0x3f9;
  iutest::AssertionHelper::OnFixed((AssertionHelper *)local_428,(Fixed *)local_1a0,false);
  if ((iu_ostream *)local_428._0_8_ != (iu_ostream *)local_418) {
    operator_delete((void *)local_428._0_8_,local_418._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

IUTEST(PrintToTest, RawArray)
{
    {
        unsigned char a[3] = {0, 1, 2};
        const unsigned char b[3] = {0, 1, 2};
        const volatile unsigned char c[3] = {0, 1, 2};
        volatile unsigned char d[3] = {0, 1, 2};

        IUTEST_SUCCEED() << ::iutest::PrintToString(a);
        IUTEST_SUCCEED() << ::iutest::PrintToString(b);
        IUTEST_SUCCEED() << ::iutest::PrintToString(c);
        IUTEST_SUCCEED() << ::iutest::PrintToString(d);
    }
    {
        char a[3] = {0, 1, 2};
        const char b[3] = {0, 1, 2};
        const volatile char c[3] = {0, 1, 2};
        volatile char d[3] = {0, 1, 2};

        IUTEST_SUCCEED() << ::iutest::PrintToString(a);
        IUTEST_SUCCEED() << ::iutest::PrintToString(b);
        IUTEST_SUCCEED() << ::iutest::PrintToString(c);
        IUTEST_SUCCEED() << ::iutest::PrintToString(d);
    }
}